

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Toplex_map.h
# Opt level: O0

bool Gudhi::
     included<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range1,
               set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *vertex_range2)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  reference __x;
  size_type sVar2;
  Vertex *v;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  undefined1 local_50 [8];
  Simplex s2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *vertex_range2_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_range1_local;
  
  s2._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)vertex_range2;
  __first = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                      (vertex_range2);
  __last = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)s2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
  set<std::_Rb_tree_const_iterator<unsigned_long>>
            ((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>> *)local_50,
             (_Rb_tree_const_iterator<unsigned_long>)__first._M_node,
             (_Rb_tree_const_iterator<unsigned_long>)__last._M_node);
  __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(vertex_range1);
  v = (Vertex *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(vertex_range1);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&v);
    if (!bVar1) {
      vertex_range1_local._7_1_ = true;
LAB_0011f018:
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_50);
      return vertex_range1_local._7_1_;
    }
    __x = __gnu_cxx::
          __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator*(&__end0);
    sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)local_50,__x);
    if (sVar2 == 0) {
      vertex_range1_local._7_1_ = false;
      goto LAB_0011f018;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

bool included(const Input_vertex_range1& vertex_range1, const Input_vertex_range2& vertex_range2) {
  Toplex_map::Simplex s2(vertex_range2.begin(), vertex_range2.end());
  for (const Toplex_map::Vertex& v : vertex_range1)
    if (!s2.count(v)) return false;
  return true;
}